

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

UniValue * __thiscall UniValue::operator[](UniValue *this,size_t index)

{
  long lVar1;
  size_type sVar2;
  ulong in_RSI;
  vector<UniValue,_std::allocator<UniValue>_> *in_RDI;
  long in_FS_OFFSET;
  vector<UniValue,_std::allocator<UniValue>_> *in_stack_ffffffffffffffc8;
  UniValue *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)&(in_RDI->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start == 1) ||
     (*(int *)&(in_RDI->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_start == 2)) {
    sVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::size(in_stack_ffffffffffffffc8);
    if (in_RSI < sVar2) {
      local_10 = std::vector<UniValue,_std::allocator<UniValue>_>::at(in_RDI,in_RSI);
    }
    else {
      local_10 = &NullUniValue;
    }
  }
  else {
    local_10 = &NullUniValue;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

const UniValue& UniValue::operator[](size_t index) const
{
    if (typ != VOBJ && typ != VARR)
        return NullUniValue;
    if (index >= values.size())
        return NullUniValue;

    return values.at(index);
}